

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

int64 __thiscall TTD::EventLog::GetKthEventTimeInLog(EventLog *this,uint32 k)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  int64 iVar3;
  uint32 uVar4;
  undefined1 local_40 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_40,&this->m_eventList);
  uVar4 = 0;
  while (((local_40 != (undefined1  [8])0x0 &&
          (*(TTEventListLink **)((long)local_40 + 8) <= iter.m_currLink)) &&
         (iter.m_currLink < (TTEventListLink *)*(size_t *)local_40))) {
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_40);
    bVar1 = NSLogEvents::IsJsRTActionRootCall(pEVar2);
    if ((bVar1) && (uVar4 = uVar4 + 1, uVar4 == k)) {
      pEVar2 = TTEventList::Iterator::Current((Iterator *)local_40);
      iVar3 = NSLogEvents::GetTimeFromRootCallOrSnapshot(pEVar2);
      return iVar3;
    }
    TTEventList::Iterator::MoveNext((Iterator *)local_40);
  }
  return -1;
}

Assistant:

int64 EventLog::GetKthEventTimeInLog(uint32 k) const
    {
        uint32 topLevelCount = 0;
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                topLevelCount++;

                if(topLevelCount == k)
                {
                    return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
                }
            }
        }

        return -1;
    }